

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Demon_Queue::Reset(Am_Demon_Queue *this)

{
  QItem *pQVar1;
  QItem *next;
  QItem *curr;
  Am_Demon_Queue *this_local;
  
  if ((this->data->active & 1U) != 0) {
    pQVar1 = this->data->head;
    while (next = pQVar1, next != (QItem *)0x0) {
      pQVar1 = next->next;
      if (next != (QItem *)0x0) {
        QItem::~QItem(next);
        QItem::operator_delete(next,0x20);
      }
    }
    this->data->tail = (QItem *)0x0;
    this->data->head = (QItem *)0x0;
    this->data->invoke_stack = 0;
  }
  return;
}

Assistant:

void
Am_Demon_Queue::Reset()
{
  if (!data->active)
    return;

  QItem *curr = data->head;
  QItem *next;

  while (curr) {
    next = curr->next;
    delete curr;
    curr = next;
  }
  data->head = data->tail = nullptr;
  data->invoke_stack = 0;
}